

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.cc
# Opt level: O1

string * __thiscall
phosg::base64_decode_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,char *alphabet)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t x;
  long lVar4;
  invalid_argument *piVar5;
  byte bVar6;
  void *pvVar7;
  string inverse_alphabet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  void *local_38;
  
  if (size == 0) {
    size = (size_t)DEFAULT_ALPHABET;
  }
  if (((ulong)vdata & 3) != 0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar5,"size must be a multiple of 4 bytes");
    __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,0x100,-1);
  lVar4 = 0;
  do {
    local_58._M_dataplus._M_p[*(char *)(size + lVar4)] = (char)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  local_58._M_dataplus._M_p[0x3d] = -0x80;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (vdata != (void *)0x0) {
    local_38 = (void *)((long)vdata + -4);
    pvVar7 = (void *)0x0;
    do {
      bVar1 = local_58._M_dataplus._M_p[(byte)this[(long)pvVar7]];
      bVar2 = local_58._M_dataplus._M_p[(byte)(this + 1)[(long)pvVar7]];
      bVar3 = local_58._M_dataplus._M_p[(byte)(this + 2)[(long)pvVar7]];
      bVar6 = local_58._M_dataplus._M_p[(byte)(this + 3)[(long)pvVar7]];
      if (bVar6 == 0x80) {
        if (local_38 != pvVar7) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(piVar5,"string contains padding not at the end")
          ;
LAB_0011526e:
          __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        if (0x3f < bVar2 || 0x3f < bVar1) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(piVar5,"string contains non-base64 characters");
          goto LAB_0011526e;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,bVar2 >> 4 | bVar1 << 2);
        bVar6 = bVar2 << 4 | bVar3 >> 2 & 0xf;
      }
      else {
        if (((0x3f < bVar1) || (0x3f < bVar2)) || (0x3f < (bVar6 | bVar3))) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(piVar5,"string contains non-base64 characters");
          goto LAB_0011526e;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,bVar2 >> 4 | bVar1 << 2);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,bVar3 >> 2 | bVar2 << 4);
        bVar6 = bVar6 | bVar3 << 6;
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,bVar6);
      pvVar7 = (void *)((long)pvVar7 + 4);
    } while (pvVar7 < vdata);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string base64_decode(const void* vdata, size_t size, const char* alphabet) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);

  if (!alphabet) {
    alphabet = DEFAULT_ALPHABET;
  }

  // the length must be a multiple of 4
  if (size & 3) {
    throw invalid_argument("size must be a multiple of 4 bytes");
  }

  // compute the inverse alphabet for easier decoding
  // TODO: make this not happen every time, at least for the default alphabets
  string inverse_alphabet(0x100, -1);
  for (uint8_t x = 0; x < 0x40; x++) {
    inverse_alphabet[alphabet[x]] = static_cast<char>(x);
  }
  inverse_alphabet['='] = -0x80;

  // decode blocks of 4 bytes first
  string ret;
  size_t end_offset = size & (~3);
  for (size_t offset = 0; offset < end_offset; offset += 4) {
    // aaaaaabb bbbbcccc ccdddddd
    uint8_t c1 = inverse_alphabet[data[offset]];
    uint8_t c2 = inverse_alphabet[data[offset + 1]];
    uint8_t c3 = inverse_alphabet[data[offset + 2]];
    uint8_t c4 = inverse_alphabet[data[offset + 3]];

    // TODO: this is pretty ugly; clean it up
    if (c4 == 0x80) {
      if (offset != end_offset - 4) {
        throw invalid_argument("string contains padding not at the end");
      }
      if (c3 == 0x80) {
        if ((c1 >= 0x40) || (c2 >= 0x40)) {
          throw invalid_argument("string contains non-base64 characters");
        }
        ret.push_back(((c1 << 2) & 0xFC) | ((c2 >> 4) & 0x03));
      } else {
        if ((c1 >= 0x40) || (c2 >= 0x40) || (c2 >= 0x40)) {
          throw invalid_argument("string contains non-base64 characters");
        }
        ret.push_back(((c1 << 2) & 0xFC) | ((c2 >> 4) & 0x03));
        ret.push_back(((c2 << 4) & 0xF0) | ((c3 >> 2) & 0x0F));
      }
    } else {
      if ((c1 >= 0x40) || (c2 >= 0x40) || (c3 >= 0x40) || (c4 >= 0x40)) {
        throw invalid_argument("string contains non-base64 characters");
      }
      ret.push_back((c1 << 2) | ((c2 >> 4) & 0x03));
      ret.push_back((c2 << 4) | ((c3 >> 2) & 0x0F));
      ret.push_back((c3 << 6) | c4);
    }
  }

  return ret;
}